

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_gnutar_filenames.c
# Opt level: O1

void test_write_format_gnutar_linknames(void)

{
  int iVar1;
  void *buff;
  archive_entry *entry;
  archive *paVar2;
  char *pcVar3;
  long lVar4;
  archive_entry *ae;
  size_t used;
  archive_entry *local_40;
  size_t local_38;
  
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                      ,L'g',0xa000,"S_IFLNK",0xa000,"AE_IFLNK",(void *)0x0);
  buff = malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                   ,L'k',(uint)(buff != (void *)0x0),"buff != NULL",(void *)0x0);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                   ,L'n',(uint)(entry != (archive_entry *)0x0),
                   "(template = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime(entry,2,0x14);
  archive_entry_set_birthtime(entry,3,0x1e);
  archive_entry_set_ctime(entry,4,0x28);
  archive_entry_set_mtime(entry,5,0x32);
  archive_entry_set_mode(entry,0xa1ed);
  archive_entry_copy_pathname(entry,"link");
  lVar4 = 1;
  do {
    (buff2 + lVar4 + 0x3f)[0] = 'a';
    (buff2 + lVar4 + 0x3f)[1] = '\0';
    archive_entry_copy_symlink(entry,filename);
    paVar2 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'|',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_gnutar(paVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'}',(uint)(iVar1 == 0),"0 == archive_write_set_format_gnutar(a)",paVar2);
    iVar1 = archive_write_add_filter_none(paVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'~',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar2);
    iVar1 = archive_write_open_memory(paVar2,buff,1000000,&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'\x7f',(uint)(iVar1 == 0),
                     "0 == archive_write_open_memory(a, buff, buffsize, &used)",paVar2);
    iVar1 = archive_write_header(paVar2,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, template)",
                        paVar2);
    iVar1 = archive_write_close(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar2);
    iVar1 = archive_write_free(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar2);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'\x86',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x87',0,"0",(long)iVar1,"archive_read_support_format_all(a)",paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x88',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",paVar2);
    iVar1 = archive_read_open_memory(paVar2,buff,local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x89',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",paVar2)
    ;
    iVar1 = archive_read_next_header(paVar2,&local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8b',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar2);
    pcVar3 = archive_entry_pathname(local_40);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
               ,L'\x8c',"link","\"link\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    pcVar3 = archive_entry_symlink(local_40);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
               ,L'\x8d',filename,"filename",pcVar3,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header(paVar2,&local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8e',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar2);
    iVar1 = archive_read_close(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar2);
    iVar1 = archive_read_free(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x7d1);
  archive_entry_free(entry);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_gnutar_linknames)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae, *template;
	struct archive *a;
	size_t used;
	int i;

#ifdef S_IFLNK
	assertEqualInt(S_IFLNK, AE_IFLNK);
#endif

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a template entry. */
	assert((template = archive_entry_new()) != NULL);
	archive_entry_set_atime(template, 2, 20);
	archive_entry_set_birthtime(template, 3, 30);
	archive_entry_set_ctime(template, 4, 40);
	archive_entry_set_mtime(template, 5, 50);
	archive_entry_set_mode(template, AE_IFLNK | 0755);
	archive_entry_copy_pathname(template, "link");

	for (i = 0; i < 2000; ++i) {
		filename[i] = 'a';
		filename[i + 1] = '\0';
		archive_entry_copy_symlink(template, filename);

		/* Write a one-item gnutar format archive. */
		assert((a = archive_write_new()) != NULL);
		assertA(0 == archive_write_set_format_gnutar(a));
		assertA(0 == archive_write_add_filter_none(a));
		assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, template));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));


		/* Read back and verify the filename. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, 0, archive_read_support_format_all(a));
		assertEqualIntA(a, 0, archive_read_support_filter_all(a));
		assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));
		
		assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
		assertEqualString("link", archive_entry_pathname(ae));
		assertEqualString(filename, archive_entry_symlink(ae));
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	}

	archive_entry_free(template);

	free(buff);
}